

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O3

int test_xmlschemas(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  FILE *__stream;
  xmlDocPtr pxVar13;
  undefined8 uVar14;
  size_t sVar15;
  xmlDocPtr pxVar16;
  xmlNodePtr val;
  xmlParserInputBufferPtr pxVar17;
  int nr;
  uint uVar18;
  ulong uVar19;
  undefined4 *puVar20;
  xmlParserInputBufferPtr pxVar21;
  int n_doc;
  uint uVar22;
  xmlParserInputBufferPtr pxVar23;
  int test_ret_4;
  int test_ret_1;
  int iVar24;
  int iVar25;
  char *__s;
  uint *puVar26;
  int test_ret;
  int iVar27;
  bool bVar28;
  undefined4 uVar29;
  int *piVar30;
  undefined8 *puVar31;
  int test_ret_2;
  int test_ret_7;
  int test_ret_8;
  undefined8 *local_48;
  int local_40;
  int local_3c;
  uint local_38;
  
  if (quiet == '\0') {
    puts("Testing xmlschemas : 16 of 27 functions ...");
  }
  iVar27 = 0;
  bVar1 = true;
  do {
    bVar28 = bVar1;
    iVar2 = xmlMemBlocks();
    if (bVar28) {
      __stream = fopen64("test.out","a+");
    }
    else {
      __stream = (FILE *)0x0;
    }
    xmlSchemaDump(__stream);
    call_tests = call_tests + 1;
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaDump",(ulong)(uint)(iVar3 - iVar2));
      iVar27 = iVar27 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    bVar1 = false;
  } while (bVar28);
  function_tests = function_tests + 1;
  iVar2 = xmlMemBlocks();
  xmlSchemaGetParserErrors(0,0,0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar2 != iVar3) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaGetParserErrors");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  uVar19 = 0;
  xmlSchemaGetValidErrors(0,0,0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar4 != iVar5) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaGetValidErrors");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    uVar19 = 0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  xmlSchemaIsValid(0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlSchemaIsValid");
    uVar19 = 0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar22 = 0;
  iVar24 = 0;
  do {
    iVar8 = xmlMemBlocks();
    pxVar13 = gen_xmlDocPtr(uVar22,(int)uVar19);
    uVar14 = xmlSchemaNewDocParserCtxt(pxVar13);
    xmlSchemaFreeParserCtxt(uVar14);
    call_tests = call_tests + 1;
    if (((pxVar13 != (xmlDocPtr)0x0) && (api_doc != pxVar13)) && (pxVar13->doc != api_doc)) {
      xmlFreeDoc(pxVar13);
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSchemaNewDocParserCtxt",(ulong)(uint)(iVar9 - iVar8));
      iVar24 = iVar24 + 1;
      uVar19 = (ulong)uVar22;
      printf(" %d");
      putchar(10);
    }
    uVar22 = uVar22 + 1;
  } while (uVar22 != 4);
  local_48._0_4_ = (uint)(iVar6 != iVar7);
  iVar2 = (uint)(iVar2 != iVar3) + iVar27 + (uint)(iVar4 != iVar5) + (uint)local_48;
  function_tests = function_tests + 1;
  iVar27 = 0;
  uVar22 = 0;
  do {
    piVar30 = &DAT_0016343c;
    uVar19 = 0;
    do {
      iVar3 = xmlMemBlocks();
      if (uVar22 == 0) {
        bVar1 = false;
        __s = "foo";
      }
      else if (uVar22 == 2) {
        bVar1 = false;
        __s = "test/ent2";
      }
      else if (uVar22 == 1) {
        bVar1 = false;
        __s = "<foo/>";
      }
      else {
        bVar1 = true;
        __s = (char *)0x0;
      }
      iVar4 = *piVar30;
      if (bVar1) {
LAB_00142fff:
        uVar14 = xmlSchemaNewMemParserCtxt(__s,iVar4);
        xmlSchemaFreeParserCtxt(uVar14);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar3 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaNewMemParserCtxt",(ulong)(uint)(iVar4 - iVar3)
                );
          iVar27 = iVar27 + 1;
          printf(" %d",(ulong)uVar22);
          printf(" %d",uVar19);
          putchar(10);
        }
      }
      else {
        sVar15 = strlen(__s);
        if (iVar4 <= (int)sVar15 + 1) goto LAB_00142fff;
      }
      uVar18 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar18;
      piVar30 = piVar30 + 1;
    } while (uVar18 != 4);
    uVar22 = uVar22 + 1;
    if (uVar22 == 4) {
      function_tests = function_tests + 1;
      puVar31 = &DAT_00165d58;
      uVar22 = 0;
      iVar3 = 0;
      do {
        iVar4 = xmlMemBlocks();
        if (uVar22 < 3) {
          uVar14 = *puVar31;
        }
        else {
          uVar14 = 0;
        }
        xmlSchemaNewParserCtxt(uVar14);
        xmlSchemaFreeParserCtxt();
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaNewParserCtxt",(ulong)(uint)(iVar5 - iVar4));
          iVar3 = iVar3 + 1;
          printf(" %d",(ulong)uVar22);
          putchar(10);
        }
        uVar22 = uVar22 + 1;
        puVar31 = puVar31 + 1;
      } while (uVar22 != 4);
      function_tests = function_tests + 1;
      iVar4 = xmlMemBlocks();
      xmlSchemaSAXUnplug(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar4 != iVar5) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaSAXUnplug",(ulong)(uint)(iVar6 - iVar4));
        printf(" %d",0);
        putchar(10);
      }
      function_tests = function_tests + 1;
      puVar26 = &DAT_0016343c;
      uVar22 = 0;
      iVar6 = 0;
      do {
        iVar7 = xmlMemBlocks();
        pxVar13 = (xmlDocPtr)(ulong)*puVar26;
        xmlSchemaSetValidOptions(0);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar8 = xmlMemBlocks();
        if (iVar7 != iVar8) {
          iVar8 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaSetValidOptions",(ulong)(uint)(iVar8 - iVar7))
          ;
          iVar6 = iVar6 + 1;
          printf(" %d",0);
          pxVar13 = (xmlDocPtr)(ulong)uVar22;
          printf(" %d");
          putchar(10);
        }
        uVar22 = uVar22 + 1;
        puVar26 = puVar26 + 1;
      } while (uVar22 != 4);
      function_tests = function_tests + 1;
      iVar7 = xmlMemBlocks();
      xmlSchemaValidCtxtGetOptions(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar7 != iVar8) {
        xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaValidCtxtGetOptions");
        pxVar13 = (xmlDocPtr)0x0;
        printf(" %d");
        putchar(10);
      }
      function_tests = function_tests + 1;
      iVar9 = xmlMemBlocks();
      uVar14 = xmlSchemaValidCtxtGetParserCtxt(0);
      xmlFreeParserCtxt(uVar14);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSchemaValidCtxtGetParserCtxt");
        pxVar13 = (xmlDocPtr)0x0;
        printf(" %d");
        putchar(10);
      }
      function_tests = function_tests + 1;
      uVar22 = 0;
      iVar25 = 0;
      do {
        iVar12 = (int)pxVar13;
        iVar11 = xmlMemBlocks();
        pxVar16 = gen_xmlDocPtr(uVar22,iVar12);
        pxVar13 = pxVar16;
        xmlSchemaValidateDoc(0);
        call_tests = call_tests + 1;
        if (((pxVar16 != (xmlDocPtr)0x0) && (api_doc != pxVar16)) && (pxVar16->doc != api_doc)) {
          xmlFreeDoc(pxVar16);
        }
        xmlResetLastError();
        iVar12 = xmlMemBlocks();
        if (iVar11 != iVar12) {
          iVar12 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaValidateDoc",(ulong)(uint)(iVar12 - iVar11));
          iVar25 = iVar25 + 1;
          printf(" %d",0);
          pxVar13 = (xmlDocPtr)(ulong)uVar22;
          printf(" %d");
          putchar(10);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != 4);
      function_tests = function_tests + 1;
      local_48._0_4_ = (uint)(iVar9 != iVar10);
      iVar27 = iVar2 + iVar24 + iVar27 + iVar3 + (uint)(iVar4 != iVar5) + iVar6 +
               (uint)(iVar7 != iVar8) + (uint)local_48;
      local_48 = &DAT_00165d90;
      iVar2 = 0;
      uVar22 = 0;
      do {
        puVar20 = &DAT_0016343c;
        uVar18 = 0;
        do {
          iVar3 = xmlMemBlocks();
          if (uVar22 < 7) {
            val = (xmlNodePtr)(&DAT_00165d90)[uVar22];
          }
          else {
            val = (xmlNodePtr)0x0;
          }
          xmlSchemaValidateFile(0,val,*puVar20);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSchemaValidateFile",(ulong)(uint)(iVar4 - iVar3));
            iVar2 = iVar2 + 1;
            printf(" %d",0);
            printf(" %d",(ulong)uVar22);
            val = (xmlNodePtr)(ulong)uVar18;
            printf(" %d");
            putchar(10);
          }
          uVar18 = uVar18 + 1;
          puVar20 = puVar20 + 1;
        } while (uVar18 != 4);
        uVar22 = uVar22 + 1;
      } while (uVar22 != 8);
      function_tests = function_tests + 1;
      uVar22 = 0;
      iVar3 = 0;
      do {
        iVar5 = (int)val;
        iVar4 = xmlMemBlocks();
        val = gen_xmlNodePtr(uVar22,iVar5);
        xmlSchemaValidateOneElement(0,val);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar22,val,nr);
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaValidateOneElement",
                 (ulong)(uint)(iVar5 - iVar4));
          iVar3 = iVar3 + 1;
          printf(" %d",0);
          val = (xmlNodePtr)(ulong)uVar22;
          printf(" %d");
          putchar(10);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != 3);
      function_tests = function_tests + 1;
      uVar22 = 0;
      local_40 = 0;
      do {
        iVar4 = xmlMemBlocks();
        if (uVar22 < 7) {
          pxVar23 = (xmlParserInputBufferPtr)*local_48;
        }
        else {
          pxVar23 = (xmlParserInputBufferPtr)0x0;
        }
        xmlSchemaValidateSetFilename(0);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar4 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSchemaValidateSetFilename",
                 (ulong)(uint)(iVar5 - iVar4));
          local_40 = local_40 + 1;
          printf(" %d",0);
          pxVar23 = (xmlParserInputBufferPtr)(ulong)uVar22;
          printf(" %d");
          putchar(10);
        }
        uVar22 = uVar22 + 1;
        local_48 = local_48 + 1;
      } while (uVar22 != 8);
      function_tests = function_tests + 1;
      local_3c = 0;
      uVar22 = 0;
      do {
        uVar18 = 0;
        do {
          local_38 = 0;
          bVar1 = true;
          do {
            bVar28 = bVar1;
            pxVar21 = (xmlParserInputBufferPtr)0x0;
            do {
              iVar5 = (int)pxVar23;
              iVar4 = xmlMemBlocks();
              pxVar17 = gen_xmlParserInputBufferPtr(uVar22,iVar5);
              uVar29 = 0xffffffff;
              if (uVar18 < 3) {
                uVar29 = (&DAT_00155228)[uVar18];
              }
              if (bVar28) {
                uVar14 = __xmlDefaultSAXHandler();
              }
              else {
                uVar14 = 0;
              }
              piVar30 = &call_tests;
              iVar5 = (int)pxVar21;
              if (iVar5 != 0) {
                if (iVar5 == 1) {
                  piVar30 = (int *)0xffffffffffffffff;
                }
                else {
                  piVar30 = (int *)0x0;
                }
              }
              pxVar23 = pxVar17;
              xmlSchemaValidateStream(0,pxVar17,uVar29,uVar14,piVar30);
              call_tests = call_tests + 1;
              xmlFreeParserInputBuffer(pxVar17);
              xmlResetLastError();
              iVar6 = xmlMemBlocks();
              if (iVar4 != iVar6) {
                iVar6 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlSchemaValidateStream",
                       (ulong)(uint)(iVar6 - iVar4));
                local_3c = local_3c + 1;
                printf(" %d",0);
                printf(" %d",(ulong)uVar22);
                printf(" %d",(ulong)uVar18);
                printf(" %d",(ulong)local_38);
                printf(" %d");
                putchar(10);
                pxVar23 = pxVar21;
              }
              pxVar21 = (xmlParserInputBufferPtr)(ulong)(iVar5 + 1U);
            } while (iVar5 + 1U != 3);
            local_38 = 1;
            bVar1 = false;
          } while (bVar28);
          uVar18 = uVar18 + 1;
        } while (uVar18 != 4);
        uVar22 = uVar22 + 1;
      } while (uVar22 != 8);
      function_tests = function_tests + 1;
      uVar22 = iVar27 + iVar25 + iVar2 + iVar3 + local_40 + local_3c;
      if (uVar22 != 0) {
        printf("Module xmlschemas: %d errors\n",(ulong)uVar22);
      }
      return uVar22;
    }
  } while( true );
}

Assistant:

static int
test_xmlschemas(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xmlschemas : 16 of 27 functions ...\n");
    test_ret += test_xmlSchemaDump();
    test_ret += test_xmlSchemaGetParserErrors();
    test_ret += test_xmlSchemaGetValidErrors();
    test_ret += test_xmlSchemaIsValid();
    test_ret += test_xmlSchemaNewDocParserCtxt();
    test_ret += test_xmlSchemaNewMemParserCtxt();
    test_ret += test_xmlSchemaNewParserCtxt();
    test_ret += test_xmlSchemaNewValidCtxt();
    test_ret += test_xmlSchemaParse();
    test_ret += test_xmlSchemaSAXPlug();
    test_ret += test_xmlSchemaSAXUnplug();
    test_ret += test_xmlSchemaSetParserErrors();
    test_ret += test_xmlSchemaSetParserStructuredErrors();
    test_ret += test_xmlSchemaSetValidErrors();
    test_ret += test_xmlSchemaSetValidOptions();
    test_ret += test_xmlSchemaSetValidStructuredErrors();
    test_ret += test_xmlSchemaValidCtxtGetOptions();
    test_ret += test_xmlSchemaValidCtxtGetParserCtxt();
    test_ret += test_xmlSchemaValidateDoc();
    test_ret += test_xmlSchemaValidateFile();
    test_ret += test_xmlSchemaValidateOneElement();
    test_ret += test_xmlSchemaValidateSetFilename();
    test_ret += test_xmlSchemaValidateSetLocator();
    test_ret += test_xmlSchemaValidateStream();

    if (test_ret != 0)
	printf("Module xmlschemas: %d errors\n", test_ret);
    return(test_ret);
}